

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-dump.c
# Opt level: O2

gboolean loudness_dump_parse(int *argc,char ***argv)

{
  gboolean gVar1;
  char *pcVar2;
  size_t sStack_20;
  
  if (decode_to_file == (gchar *)0x0) {
    gVar1 = parse_mode_args(argc,argv,entries);
    if (gVar1 == 0) {
      gVar1 = 0;
      if (*argc != 1) {
        return 0;
      }
      pcVar2 = "Missing arguments\n";
      sStack_20 = 0x12;
    }
    else {
      if (((byte)((-(momentary != 0.0) & 1U) + (shortterm != 0.0) + (integrated != 0.0)) != '\x01')
         || (interval = momentary + shortterm + integrated, interval <= 0.0)) {
        pcVar2 = "Exactly one of -m, -s and -i must be positive!\n";
        sStack_20 = 0x2f;
        goto LAB_0010337a;
      }
      gVar1 = 1;
      if ((momentary <= 0.4) && (shortterm <= 3.0)) {
        return 1;
      }
      pcVar2 = "Warning: you may lose samples when specifying this interval!\n";
      sStack_20 = 0x3d;
    }
    fwrite(pcVar2,sStack_20,1,_stderr);
  }
  else {
    pcVar2 = "Cannot decode to file in dump mode\n";
    sStack_20 = 0x23;
LAB_0010337a:
    fwrite(pcVar2,sStack_20,1,_stderr);
    gVar1 = 0;
  }
  return gVar1;
}

Assistant:

gboolean
loudness_dump_parse(int *argc, char **argv[])
{
	if (decode_to_file) {
		fprintf(stderr, "Cannot decode to file in dump mode\n");
		return FALSE;
	}

	if (!parse_mode_args(argc, argv, entries)) {
		if (*argc == 1)
			fprintf(stderr, "Missing arguments\n");
		return FALSE;
	}

	if ((momentary != 0.0) + (shortterm != 0.0) + (integrated != 0.0) !=
		1 ||
	    (interval = momentary + shortterm + integrated) <= 0.0) {
		fprintf(stderr,
		    "Exactly one of -m, -s and -i must be positive!\n");
		return FALSE;
	}

	if (momentary > 0.4 || shortterm > 3.0) {
		fprintf(stderr,
		    "Warning: you may lose samples when specifying "
		    "this interval!\n");
	}
	return TRUE;
}